

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  Precalculations *pPVar17;
  AABBNodeMB4D *node1;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  float *vertices_2;
  ulong uVar22;
  size_t sVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  float *vertices;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  bool bVar34;
  bool bVar35;
  byte bVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  uint uVar60;
  undefined1 auVar61 [16];
  uint uVar62;
  uint uVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar68 [16];
  uint uVar69;
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  NodeRef *local_a80;
  undefined8 local_a28;
  undefined8 uStack_a20;
  NodeRef *local_a18;
  Scene *scene;
  ulong local_a08;
  ulong local_a00;
  ulong local_9f8;
  ulong local_9f0;
  ulong local_9e8;
  ulong local_9e0;
  ulong local_9d8;
  ulong local_9d0;
  RTCFilterFunctionNArguments args;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  byte local_8d7;
  float local_8c8 [4];
  undefined1 local_8b8 [16];
  float local_8a8 [4];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined4 local_848;
  undefined4 uStack_844;
  undefined4 uStack_840;
  undefined4 uStack_83c;
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint uStack_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  local_a80 = stack + 1;
  stack[0] = root;
  auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar70 = ZEXT1664(auVar38);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar71 = ZEXT1664(auVar39);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar72 = ZEXT1664(auVar40);
  auVar38 = vmulss_avx512f(auVar38,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  uVar60 = auVar38._0_4_;
  auVar38 = vmulss_avx512f(auVar39,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar62 = auVar38._0_4_;
  auVar38 = vmulss_avx512f(auVar40,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar63 = auVar38._0_4_;
  local_9d8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_9e0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_9e8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_9f0 = local_9d8 ^ 0x10;
  local_9f8 = local_9e0 ^ 0x10;
  local_a00 = local_9e8 ^ 0x10;
  auVar38 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar73 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar74 = ZEXT1664(auVar38);
  auVar39._0_8_ = CONCAT44(uVar60,uVar60) ^ 0x8000000080000000;
  auVar39._8_4_ = uVar60 ^ 0x80000000;
  auVar39._12_4_ = uVar60 ^ 0x80000000;
  auVar40._0_8_ = CONCAT44(uVar62,uVar62) ^ 0x8000000080000000;
  auVar40._8_4_ = uVar62 ^ 0x80000000;
  auVar40._12_4_ = uVar62 ^ 0x80000000;
  auVar68._0_8_ = CONCAT44(uVar63,uVar63) ^ 0x8000000080000000;
  auVar68._8_4_ = uVar63 ^ 0x80000000;
  auVar68._12_4_ = uVar63 ^ 0x80000000;
  auVar38 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  do {
    local_a18 = local_a80;
    if (local_a80 == stack) break;
    sVar23 = local_a80[-1].ptr;
    local_a80 = local_a80 + -1;
    do {
      if ((sVar23 & 8) == 0) {
        uVar18 = sVar23 & 0xfffffffffffffff0;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar55._4_4_ = uVar2;
        auVar55._0_4_ = uVar2;
        auVar55._8_4_ = uVar2;
        auVar55._12_4_ = uVar2;
        auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + local_9d8),auVar55,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + local_9d8));
        auVar41 = vfmadd213ps_avx512vl(auVar43,auVar70._0_16_,auVar39);
        auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + local_9e0),auVar55,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + local_9e0));
        auVar42 = vmaxps_avx512vl(auVar73._0_16_,auVar41);
        auVar41 = vfmadd213ps_avx512vl(auVar43,auVar71._0_16_,auVar40);
        auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + local_9e8),auVar55,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + local_9e8));
        auVar43 = vfmadd213ps_avx512vl(auVar43,auVar72._0_16_,auVar68);
        auVar43 = vmaxps_avx(auVar41,auVar43);
        auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + local_9f0),auVar55,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + local_9f0));
        auVar43 = vmaxps_avx(auVar42,auVar43);
        auVar42 = vfmadd213ps_avx512vl(auVar41,auVar70._0_16_,auVar39);
        auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + local_9f8),auVar55,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + local_9f8));
        auVar42 = vminps_avx512vl(auVar74._0_16_,auVar42);
        auVar44 = vfmadd213ps_avx512vl(auVar41,auVar71._0_16_,auVar40);
        auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + local_a00),auVar55,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + local_a00));
        auVar41 = vfmadd213ps_avx512vl(auVar41,auVar72._0_16_,auVar68);
        auVar41 = vminps_avx(auVar44,auVar41);
        auVar41 = vminps_avx(auVar42,auVar41);
        uVar13 = vcmpps_avx512vl(auVar43,auVar41,2);
        bVar36 = (byte)uVar13;
        if (((uint)sVar23 & 7) == 6) {
          uVar13 = vcmpps_avx512vl(auVar55,*(undefined1 (*) [16])(uVar18 + 0xf0),1);
          uVar14 = vcmpps_avx512vl(auVar55,*(undefined1 (*) [16])(uVar18 + 0xe0),0xd);
          bVar36 = (byte)uVar13 & (byte)uVar14 & bVar36;
        }
        pre = (Precalculations *)CONCAT44((int)((ulong)pre >> 0x20),(uint)bVar36);
      }
      if ((sVar23 & 8) == 0) {
        if (pre == (Precalculations *)0x0) {
          uVar60 = 4;
        }
        else {
          uVar18 = sVar23 & 0xfffffffffffffff0;
          lVar21 = 0;
          for (pPVar17 = pre; ((ulong)pPVar17 & 1) == 0;
              pPVar17 = (Precalculations *)((ulong)pPVar17 >> 1 | 0x8000000000000000)) {
            lVar21 = lVar21 + 1;
          }
          uVar60 = 0;
          for (uVar19 = (ulong)(pre + -1) & (ulong)pre; sVar23 = *(size_t *)(uVar18 + lVar21 * 8),
              uVar19 != 0; uVar19 = uVar19 - 1 & uVar19) {
            local_a80->ptr = sVar23;
            local_a80 = local_a80 + 1;
            lVar21 = 0;
            for (uVar33 = uVar19; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
              lVar21 = lVar21 + 1;
            }
          }
        }
      }
      else {
        uVar60 = 6;
      }
    } while (uVar60 == 0);
    if (uVar60 == 6) {
      uVar60 = 0;
      local_a08 = (ulong)((uint)sVar23 & 0xf) - 8;
      bVar34 = local_a08 != 0;
      if (bVar34) {
        uVar19 = sVar23 & 0xfffffffffffffff0;
        uVar18 = 0;
        do {
          lVar20 = uVar18 * 0x50;
          scene = context->scene;
          pGVar8 = (scene->geometries).items[*(uint *)(uVar19 + 0x30 + lVar20)].ptr;
          fVar64 = (pGVar8->time_range).lower;
          fVar64 = pGVar8->fnumTimeSegments *
                   ((*(float *)(ray + k * 4 + 0x70) - fVar64) /
                   ((pGVar8->time_range).upper - fVar64));
          auVar43 = vroundss_avx(ZEXT416((uint)fVar64),ZEXT416((uint)fVar64),9);
          auVar43 = vminss_avx(auVar43,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
          auVar10 = vmaxss_avx(ZEXT816(0) << 0x20,auVar43);
          lVar31 = (long)(int)auVar10._0_4_ * 0x38;
          lVar21 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar31);
          auVar43 = *(undefined1 (*) [16])(lVar21 + (ulong)*(uint *)(uVar19 + lVar20) * 4);
          uVar33 = (ulong)*(uint *)(uVar19 + 0x10 + lVar20);
          auVar41 = *(undefined1 (*) [16])(lVar21 + uVar33 * 4);
          uVar37 = (ulong)*(uint *)(uVar19 + 0x20 + lVar20);
          auVar42 = *(undefined1 (*) [16])(lVar21 + uVar37 * 4);
          uVar24 = (ulong)*(uint *)(uVar19 + 4 + lVar20);
          auVar44 = *(undefined1 (*) [16])(lVar21 + uVar24 * 4);
          uVar25 = (ulong)*(uint *)(uVar19 + 0x14 + lVar20);
          auVar55 = *(undefined1 (*) [16])(lVar21 + uVar25 * 4);
          uVar26 = (ulong)*(uint *)(uVar19 + 0x24 + lVar20);
          auVar58 = *(undefined1 (*) [16])(lVar21 + uVar26 * 4);
          uVar27 = (ulong)*(uint *)(uVar19 + 8 + lVar20);
          auVar45 = *(undefined1 (*) [16])(lVar21 + uVar27 * 4);
          uVar28 = (ulong)*(uint *)(uVar19 + 0x18 + lVar20);
          auVar47 = *(undefined1 (*) [16])(lVar21 + uVar28 * 4);
          uVar29 = (ulong)*(uint *)(uVar19 + 0x28 + lVar20);
          auVar57 = *(undefined1 (*) [16])(lVar21 + uVar29 * 4);
          uVar22 = (ulong)*(uint *)(uVar19 + 0xc + lVar20);
          auVar4 = *(undefined1 (*) [16])(lVar21 + uVar22 * 4);
          uVar30 = (ulong)*(uint *)(uVar19 + 0x1c + lVar20);
          auVar56 = *(undefined1 (*) [16])(lVar21 + uVar30 * 4);
          lVar31 = *(long *)(*(long *)&pGVar8[2].numPrimitives + 0x38 + lVar31);
          uVar32 = (ulong)*(uint *)(uVar19 + 0x2c + lVar20);
          auVar46 = *(undefined1 (*) [16])(lVar21 + uVar32 * 4);
          auVar48 = *(undefined1 (*) [16])(lVar31 + (ulong)*(uint *)(uVar19 + lVar20) * 4);
          auVar49 = *(undefined1 (*) [16])(lVar31 + uVar33 * 4);
          auVar52 = *(undefined1 (*) [16])(lVar31 + uVar37 * 4);
          auVar50 = *(undefined1 (*) [16])(lVar31 + uVar24 * 4);
          auVar51 = *(undefined1 (*) [16])(lVar31 + uVar25 * 4);
          auVar53 = *(undefined1 (*) [16])(lVar31 + uVar26 * 4);
          auVar54 = *(undefined1 (*) [16])(lVar31 + uVar27 * 4);
          auVar61 = *(undefined1 (*) [16])(lVar31 + uVar28 * 4);
          auVar5 = *(undefined1 (*) [16])(lVar31 + uVar29 * 4);
          auVar6 = *(undefined1 (*) [16])(lVar31 + uVar22 * 4);
          auVar59 = *(undefined1 (*) [16])(lVar31 + uVar30 * 4);
          auVar7 = *(undefined1 (*) [16])(lVar31 + uVar32 * 4);
          puVar1 = (undefined8 *)(uVar19 + 0x30 + lVar20);
          local_928 = *puVar1;
          uStack_920 = puVar1[1];
          puVar1 = (undefined8 *)(uVar19 + 0x40 + lVar20);
          auVar11 = vunpcklps_avx(auVar43,auVar45);
          auVar43 = vunpckhps_avx(auVar43,auVar45);
          auVar45 = vunpcklps_avx(auVar44,auVar4);
          auVar44 = vunpckhps_avx(auVar44,auVar4);
          auVar4 = vunpcklps_avx(auVar43,auVar44);
          auVar12 = vunpcklps_avx(auVar11,auVar45);
          auVar43 = vunpckhps_avx(auVar11,auVar45);
          auVar45 = vunpcklps_avx(auVar41,auVar47);
          auVar41 = vunpckhps_avx(auVar41,auVar47);
          auVar47 = vunpcklps_avx(auVar55,auVar56);
          auVar44 = vunpckhps_avx(auVar55,auVar56);
          auVar55 = vunpcklps_avx(auVar41,auVar44);
          auVar56 = vunpcklps_avx(auVar45,auVar47);
          auVar41 = vunpckhps_avx(auVar45,auVar47);
          auVar45 = vunpcklps_avx(auVar42,auVar57);
          auVar42 = vunpckhps_avx(auVar42,auVar57);
          auVar47 = vunpcklps_avx(auVar58,auVar46);
          auVar44 = vunpckhps_avx(auVar58,auVar46);
          auVar58 = vunpcklps_avx(auVar42,auVar44);
          auVar57 = vunpcklps_avx(auVar45,auVar47);
          auVar42 = vunpckhps_avx(auVar45,auVar47);
          auVar44 = vunpcklps_avx512vl(auVar48,auVar54);
          auVar45 = vunpckhps_avx512vl(auVar48,auVar54);
          auVar46 = vunpcklps_avx512vl(auVar50,auVar6);
          auVar47 = vunpckhps_avx512vl(auVar50,auVar6);
          auVar45 = vunpcklps_avx(auVar45,auVar47);
          auVar47 = vunpcklps_avx(auVar44,auVar46);
          auVar44 = vunpckhps_avx(auVar44,auVar46);
          auVar46 = vunpcklps_avx512vl(auVar49,auVar61);
          auVar48 = vunpckhps_avx512vl(auVar49,auVar61);
          auVar49 = vunpcklps_avx512vl(auVar51,auVar59);
          auVar50 = vunpckhps_avx512vl(auVar51,auVar59);
          auVar48 = vunpcklps_avx512vl(auVar48,auVar50);
          auVar50 = vunpcklps_avx512vl(auVar46,auVar49);
          auVar49 = vunpckhps_avx512vl(auVar46,auVar49);
          auVar51 = vunpcklps_avx512vl(auVar52,auVar5);
          auVar46 = vunpckhps_avx512vl(auVar52,auVar5);
          auVar52 = vunpcklps_avx512vl(auVar53,auVar7);
          auVar53 = vunpckhps_avx512vl(auVar53,auVar7);
          auVar46 = vunpcklps_avx(auVar46,auVar53);
          auVar53 = vunpcklps_avx512vl(auVar51,auVar52);
          auVar52 = vunpckhps_avx512vl(auVar51,auVar52);
          auVar54 = ZEXT416((uint)(fVar64 - auVar10._0_4_));
          auVar51 = vbroadcastss_avx512vl(auVar54);
          auVar54 = vsubss_avx512f(ZEXT416(0x3f800000),auVar54);
          auVar61._0_4_ = auVar54._0_4_;
          auVar61._4_4_ = auVar61._0_4_;
          auVar61._8_4_ = auVar61._0_4_;
          auVar61._12_4_ = auVar61._0_4_;
          auVar47 = vmulps_avx512vl(auVar51,auVar47);
          auVar44 = vmulps_avx512vl(auVar51,auVar44);
          auVar54 = vmulps_avx512vl(auVar51,auVar45);
          auVar45 = vfmadd231ps_fma(auVar47,auVar61,auVar12);
          auVar47 = vfmadd231ps_fma(auVar44,auVar61,auVar43);
          auVar4 = vfmadd231ps_fma(auVar54,auVar61,auVar4);
          auVar43 = vmulps_avx512vl(auVar51,auVar50);
          auVar44 = vmulps_avx512vl(auVar51,auVar49);
          auVar48 = vmulps_avx512vl(auVar51,auVar48);
          auVar43 = vfmadd231ps_fma(auVar43,auVar61,auVar56);
          auVar41 = vfmadd231ps_fma(auVar44,auVar61,auVar41);
          auVar44 = vfmadd231ps_fma(auVar48,auVar61,auVar55);
          auVar55 = vmulps_avx512vl(auVar51,auVar53);
          auVar56 = vmulps_avx512vl(auVar51,auVar52);
          auVar46 = vmulps_avx512vl(auVar51,auVar46);
          auVar55 = vfmadd231ps_fma(auVar55,auVar61,auVar57);
          auVar57 = vfmadd231ps_fma(auVar56,auVar61,auVar42);
          auVar58 = vfmadd231ps_fma(auVar46,auVar61,auVar58);
          local_938 = *puVar1;
          uStack_930 = puVar1[1];
          auVar43 = vsubps_avx(auVar45,auVar43);
          auVar41 = vsubps_avx(auVar47,auVar41);
          auVar42 = vsubps_avx(auVar4,auVar44);
          auVar44 = vsubps_avx(auVar55,auVar45);
          auVar56 = vsubps_avx512vl(auVar57,auVar47);
          auVar55 = vsubps_avx(auVar58,auVar4);
          auVar46._0_4_ = auVar41._0_4_ * auVar55._0_4_;
          auVar46._4_4_ = auVar41._4_4_ * auVar55._4_4_;
          auVar46._8_4_ = auVar41._8_4_ * auVar55._8_4_;
          auVar46._12_4_ = auVar41._12_4_ * auVar55._12_4_;
          local_898 = vfmsub231ps_avx512vl(auVar46,auVar56,auVar42);
          auVar48._0_4_ = auVar42._0_4_ * auVar44._0_4_;
          auVar48._4_4_ = auVar42._4_4_ * auVar44._4_4_;
          auVar48._8_4_ = auVar42._8_4_ * auVar44._8_4_;
          auVar48._12_4_ = auVar42._12_4_ * auVar44._12_4_;
          local_888 = vfmsub231ps_fma(auVar48,auVar55,auVar43);
          auVar57 = vmulps_avx512vl(auVar43,auVar56);
          fVar64 = *(float *)(ray + k * 4 + 0x40);
          auVar50._4_4_ = fVar64;
          auVar50._0_4_ = fVar64;
          auVar50._8_4_ = fVar64;
          auVar50._12_4_ = fVar64;
          fVar65 = *(float *)(ray + k * 4 + 0x50);
          auVar51._4_4_ = fVar65;
          auVar51._0_4_ = fVar65;
          auVar51._8_4_ = fVar65;
          auVar51._12_4_ = fVar65;
          auVar46 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
          uVar2 = *(undefined4 *)(ray + k * 4);
          auVar58._4_4_ = uVar2;
          auVar58._0_4_ = uVar2;
          auVar58._8_4_ = uVar2;
          auVar58._12_4_ = uVar2;
          auVar48 = vsubps_avx512vl(auVar45,auVar58);
          local_878 = vfmsub231ps_fma(auVar57,auVar44,auVar41);
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar45._4_4_ = uVar2;
          auVar45._0_4_ = uVar2;
          auVar45._8_4_ = uVar2;
          auVar45._12_4_ = uVar2;
          auVar49 = vsubps_avx512vl(auVar47,auVar45);
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar47._4_4_ = uVar2;
          auVar47._0_4_ = uVar2;
          auVar47._8_4_ = uVar2;
          auVar47._12_4_ = uVar2;
          auVar47 = vsubps_avx512vl(auVar4,auVar47);
          auVar52._0_4_ = fVar65 * auVar47._0_4_;
          auVar52._4_4_ = fVar65 * auVar47._4_4_;
          auVar52._8_4_ = fVar65 * auVar47._8_4_;
          auVar52._12_4_ = fVar65 * auVar47._12_4_;
          auVar52 = vfmsub231ps_avx512vl(auVar52,auVar49,auVar46);
          auVar58 = vmulps_avx512vl(auVar46,auVar48);
          auVar58 = vfmsub231ps_fma(auVar58,auVar47,auVar50);
          auVar54._0_4_ = fVar64 * auVar49._0_4_;
          auVar54._4_4_ = fVar64 * auVar49._4_4_;
          auVar54._8_4_ = fVar64 * auVar49._8_4_;
          auVar54._12_4_ = fVar64 * auVar49._12_4_;
          auVar45 = vfmsub231ps_fma(auVar54,auVar48,auVar51);
          auVar57 = vmulps_avx512vl(local_878,auVar46);
          auVar57 = vfmadd231ps_avx512vl(auVar57,local_888,auVar51);
          auVar46 = vfmadd231ps_avx512vl(auVar57,local_898,auVar50);
          auVar57._8_4_ = 0x7fffffff;
          auVar57._0_8_ = 0x7fffffff7fffffff;
          auVar57._12_4_ = 0x7fffffff;
          local_8e8 = vandps_avx512vl(auVar46,auVar57);
          auVar4._8_4_ = 0x80000000;
          auVar4._0_8_ = 0x8000000080000000;
          auVar4._12_4_ = 0x80000000;
          auVar57 = vandps_avx512vl(auVar46,auVar4);
          auVar53._0_4_ = auVar55._0_4_ * auVar45._0_4_;
          auVar53._4_4_ = auVar55._4_4_ * auVar45._4_4_;
          auVar53._8_4_ = auVar55._8_4_ * auVar45._8_4_;
          auVar53._12_4_ = auVar55._12_4_ * auVar45._12_4_;
          auVar55 = vfmadd231ps_avx512vl(auVar53,auVar58,auVar56);
          auVar44 = vfmadd231ps_fma(auVar55,auVar52,auVar44);
          uVar60 = auVar57._0_4_;
          local_918._0_4_ = (float)(uVar60 ^ auVar44._0_4_);
          uVar62 = auVar57._4_4_;
          local_918._4_4_ = (float)(uVar62 ^ auVar44._4_4_);
          uVar63 = auVar57._8_4_;
          local_918._8_4_ = (float)(uVar63 ^ auVar44._8_4_);
          uVar69 = auVar57._12_4_;
          local_918._12_4_ = (float)(uVar69 ^ auVar44._12_4_);
          auVar44._0_4_ = auVar42._0_4_ * auVar45._0_4_;
          auVar44._4_4_ = auVar42._4_4_ * auVar45._4_4_;
          auVar44._8_4_ = auVar42._8_4_ * auVar45._8_4_;
          auVar44._12_4_ = auVar42._12_4_ * auVar45._12_4_;
          auVar41 = vfmadd231ps_fma(auVar44,auVar41,auVar58);
          auVar43 = vfmadd231ps_fma(auVar41,auVar43,auVar52);
          local_908._0_4_ = (float)(uVar60 ^ auVar43._0_4_);
          local_908._4_4_ = (float)(uVar62 ^ auVar43._4_4_);
          local_908._8_4_ = (float)(uVar63 ^ auVar43._8_4_);
          local_908._12_4_ = (float)(uVar69 ^ auVar43._12_4_);
          auVar43 = ZEXT816(0) << 0x20;
          uVar13 = vcmpps_avx512vl(local_918,auVar43,5);
          uVar14 = vcmpps_avx512vl(local_908,auVar43,5);
          uVar15 = vcmpps_avx512vl(auVar46,auVar43,4);
          auVar43._0_4_ = local_908._0_4_ + local_918._0_4_;
          auVar43._4_4_ = local_908._4_4_ + local_918._4_4_;
          auVar43._8_4_ = local_908._8_4_ + local_918._8_4_;
          auVar43._12_4_ = local_908._12_4_ + local_918._12_4_;
          uVar16 = vcmpps_avx512vl(auVar43,local_8e8,2);
          local_8d7 = (byte)uVar13 & (byte)uVar14 & (byte)uVar15 & (byte)uVar16;
          if (local_8d7 != 0) {
            auVar56._0_4_ = local_878._0_4_ * auVar47._0_4_;
            auVar56._4_4_ = local_878._4_4_ * auVar47._4_4_;
            auVar56._8_4_ = local_878._8_4_ * auVar47._8_4_;
            auVar56._12_4_ = local_878._12_4_ * auVar47._12_4_;
            auVar43 = vfmadd213ps_fma(auVar49,local_888,auVar56);
            auVar43 = vfmadd213ps_fma(auVar48,local_898,auVar43);
            local_8f8._0_4_ = (float)(uVar60 ^ auVar43._0_4_);
            local_8f8._4_4_ = (float)(uVar62 ^ auVar43._4_4_);
            local_8f8._8_4_ = (float)(uVar63 ^ auVar43._8_4_);
            local_8f8._12_4_ = (float)(uVar69 ^ auVar43._12_4_);
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar41._4_4_ = uVar2;
            auVar41._0_4_ = uVar2;
            auVar41._8_4_ = uVar2;
            auVar41._12_4_ = uVar2;
            auVar43 = vmulps_avx512vl(local_8e8,auVar41);
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar42._4_4_ = uVar2;
            auVar42._0_4_ = uVar2;
            auVar42._8_4_ = uVar2;
            auVar42._12_4_ = uVar2;
            auVar41 = vmulps_avx512vl(local_8e8,auVar42);
            uVar13 = vcmpps_avx512vl(local_8f8,auVar41,2);
            uVar14 = vcmpps_avx512vl(auVar43,local_8f8,1);
            local_8d7 = (byte)uVar13 & (byte)uVar14 & local_8d7;
            if (local_8d7 != 0) {
              auVar43 = vrcp14ps_avx512vl(local_8e8);
              auVar49._8_4_ = 0x3f800000;
              auVar49._0_8_ = &DAT_3f8000003f800000;
              auVar49._12_4_ = 0x3f800000;
              auVar41 = vfnmadd213ps_avx512vl(local_8e8,auVar43,auVar49);
              auVar43 = vfmadd132ps_fma(auVar41,auVar43,auVar43);
              fVar64 = auVar43._0_4_;
              fVar65 = auVar43._4_4_;
              fVar66 = auVar43._8_4_;
              fVar67 = auVar43._12_4_;
              local_8a8[0] = fVar64 * local_8f8._0_4_;
              local_8a8[1] = fVar65 * local_8f8._4_4_;
              local_8a8[2] = fVar66 * local_8f8._8_4_;
              local_8a8[3] = fVar67 * local_8f8._12_4_;
              local_8c8[0] = fVar64 * local_918._0_4_;
              local_8c8[1] = fVar65 * local_918._4_4_;
              local_8c8[2] = fVar66 * local_918._8_4_;
              local_8c8[3] = fVar67 * local_918._12_4_;
              local_8b8._0_4_ = fVar64 * local_908._0_4_;
              local_8b8._4_4_ = fVar65 * local_908._4_4_;
              local_8b8._8_4_ = fVar66 * local_908._8_4_;
              local_8b8._12_4_ = fVar67 * local_908._12_4_;
              uVar33 = (ulong)local_8d7;
              local_9d0 = uVar18;
              do {
                uVar22 = 0;
                for (uVar37 = uVar33; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000)
                {
                  uVar22 = uVar22 + 1;
                }
                pGVar8 = (scene->geometries).items[*(uint *)((long)&local_928 + uVar22 * 4)].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  uVar33 = uVar33 ^ 1L << (uVar22 & 0x3f);
                  bVar35 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar35 = false;
                }
                else {
                  uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
                  uVar37 = (ulong)(uint)((int)uVar22 * 4);
                  uVar3 = *(undefined4 *)((long)local_8c8 + uVar37);
                  local_838._4_4_ = uVar3;
                  local_838._0_4_ = uVar3;
                  local_838._8_4_ = uVar3;
                  local_838._12_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_8b8 + uVar37);
                  local_828._4_4_ = uVar3;
                  local_828._0_4_ = uVar3;
                  local_828._8_4_ = uVar3;
                  local_828._12_4_ = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_8a8 + uVar37);
                  args.context = context->user;
                  local_808 = vpbroadcastd_avx512vl();
                  uVar3 = *(undefined4 *)((long)&local_938 + uVar37);
                  local_818._4_4_ = uVar3;
                  local_818._0_4_ = uVar3;
                  local_818._8_4_ = uVar3;
                  local_818._12_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_898 + uVar37);
                  local_858 = *(undefined4 *)(local_888 + uVar37);
                  local_848 = *(undefined4 *)(local_878 + uVar37);
                  local_868[0] = (RTCHitN)(char)uVar3;
                  local_868[1] = (RTCHitN)(char)((uint)uVar3 >> 8);
                  local_868[2] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                  local_868[3] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                  local_868[4] = (RTCHitN)(char)uVar3;
                  local_868[5] = (RTCHitN)(char)((uint)uVar3 >> 8);
                  local_868[6] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                  local_868[7] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                  local_868[8] = (RTCHitN)(char)uVar3;
                  local_868[9] = (RTCHitN)(char)((uint)uVar3 >> 8);
                  local_868[10] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                  local_868[0xb] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                  local_868[0xc] = (RTCHitN)(char)uVar3;
                  local_868[0xd] = (RTCHitN)(char)((uint)uVar3 >> 8);
                  local_868[0xe] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                  local_868[0xf] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                  uStack_854 = local_858;
                  uStack_850 = local_858;
                  uStack_84c = local_858;
                  uStack_844 = local_848;
                  uStack_840 = local_848;
                  uStack_83c = local_848;
                  vpcmpeqd_avx2(ZEXT1632(local_808),ZEXT1632(local_808));
                  uStack_7f4 = (args.context)->instID[0];
                  local_7f8 = uStack_7f4;
                  uStack_7f0 = uStack_7f4;
                  uStack_7ec = uStack_7f4;
                  uStack_7e8 = (args.context)->instPrimID[0];
                  uStack_7e4 = uStack_7e8;
                  uStack_7e0 = uStack_7e8;
                  uStack_7dc = uStack_7e8;
                  local_948 = auVar38._0_8_;
                  uStack_940 = auVar38._8_8_;
                  local_a28 = local_948;
                  uStack_a20 = uStack_940;
                  args.valid = (int *)&local_a28;
                  args.geometryUserPtr = pGVar8->userPtr;
                  args.hit = local_868;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->occlusionFilterN)(&args);
                  }
                  auVar5._8_8_ = uStack_a20;
                  auVar5._0_8_ = local_a28;
                  uVar37 = vptestmd_avx512vl(auVar5,auVar5);
                  if ((uVar37 & 0xf) == 0) {
                    bVar35 = true;
                  }
                  else {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&args);
                    }
                    auVar6._8_8_ = uStack_a20;
                    auVar6._0_8_ = local_a28;
                    uVar37 = vptestmd_avx512vl(auVar6,auVar6);
                    uVar37 = uVar37 & 0xf;
                    auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar35 = (bool)((byte)uVar37 & 1);
                    auVar59._0_4_ =
                         (uint)bVar35 * auVar43._0_4_ | (uint)!bVar35 * *(int *)(args.ray + 0x80);
                    bVar35 = (bool)((byte)(uVar37 >> 1) & 1);
                    auVar59._4_4_ =
                         (uint)bVar35 * auVar43._4_4_ | (uint)!bVar35 * *(int *)(args.ray + 0x84);
                    bVar35 = (bool)((byte)(uVar37 >> 2) & 1);
                    auVar59._8_4_ =
                         (uint)bVar35 * auVar43._8_4_ | (uint)!bVar35 * *(int *)(args.ray + 0x88);
                    bVar35 = SUB81(uVar37 >> 3,0);
                    auVar59._12_4_ =
                         (uint)bVar35 * auVar43._12_4_ | (uint)!bVar35 * *(int *)(args.ray + 0x8c);
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar59;
                    bVar35 = (byte)uVar37 == 0;
                  }
                  if (bVar35) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar2;
                    uVar33 = uVar33 ^ 1L << (uVar22 & 0x3f);
                  }
                  auVar70 = ZEXT1664(auVar70._0_16_);
                  auVar71 = ZEXT1664(auVar71._0_16_);
                  auVar72 = ZEXT1664(auVar72._0_16_);
                  auVar73 = ZEXT1664(auVar73._0_16_);
                  auVar74 = ZEXT1664(auVar74._0_16_);
                }
                uVar60 = 0;
                if (!bVar35) {
                  if (bVar34) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    uVar60 = 1;
                  }
                  goto LAB_00766cc7;
                }
              } while (uVar33 != 0);
            }
          }
          uVar60 = 0;
          uVar18 = uVar18 + 1;
          bVar34 = uVar18 < local_a08;
        } while (uVar18 != local_a08);
      }
    }
LAB_00766cc7:
  } while ((uVar60 & 3) == 0);
  return local_a18 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }